

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void finishbinexpval(FuncState *fs,expdesc *e1,expdesc *e2,OpCode op,int v2,int flip,int line,
                    OpCode mmop,TMS event)

{
  int B;
  int iVar1;
  int pc;
  int v1;
  int flip_local;
  int v2_local;
  OpCode op_local;
  expdesc *e2_local;
  expdesc *e1_local;
  FuncState *fs_local;
  
  B = luaK_exp2anyreg(fs,e1);
  iVar1 = luaK_codeABCk(fs,op,0,B,v2,0);
  freeexps(fs,e1,e2);
  (e1->u).info = iVar1;
  e1->k = VRELOC;
  luaK_fixline(fs,line);
  luaK_codeABCk(fs,mmop,B,v2,event,flip);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void finishbinexpval (FuncState *fs, expdesc *e1, expdesc *e2,
                             OpCode op, int v2, int flip, int line,
                             OpCode mmop, TMS event) {
  int v1 = luaK_exp2anyreg(fs, e1);
  int pc = luaK_codeABCk(fs, op, 0, v1, v2, 0);
  freeexps(fs, e1, e2);
  e1->u.info = pc;
  e1->k = VRELOC;  /* all those operations are relocatable */
  luaK_fixline(fs, line);
  luaK_codeABCk(fs, mmop, v1, v2, cast_int(event), flip);  /* metamethod */
  luaK_fixline(fs, line);
}